

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int glfwPlatformSupported(int platformID)

{
  uint in_EDI;
  size_t i;
  size_t count;
  ulong local_18;
  int local_4;
  
  if ((((in_EDI == 0x60001) || (in_EDI == 0x60002)) || (in_EDI == 0x60003)) ||
     ((in_EDI == 0x60004 || (in_EDI == 0x60005)))) {
    if (in_EDI == 0x60005) {
      local_4 = 1;
    }
    else {
      for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
        if (in_EDI == supportedPlatforms[local_18].ID) {
          return 1;
        }
      }
      local_4 = 0;
    }
  }
  else {
    _glfwInputError(0x10003,"Invalid platform ID 0x%08X",(ulong)in_EDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

GLFWAPI int glfwPlatformSupported(int platformID)
{
    const size_t count = sizeof(supportedPlatforms) / sizeof(supportedPlatforms[0]);
    size_t i;

    if (platformID != GLFW_PLATFORM_WIN32 &&
        platformID != GLFW_PLATFORM_COCOA &&
        platformID != GLFW_PLATFORM_WAYLAND &&
        platformID != GLFW_PLATFORM_X11 &&
        platformID != GLFW_PLATFORM_NULL)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid platform ID 0x%08X", platformID);
        return GLFW_FALSE;
    }

    if (platformID == GLFW_PLATFORM_NULL)
        return GLFW_TRUE;

    for (i = 0;  i < count;  i++)
    {
        if (platformID == supportedPlatforms[i].ID)
            return GLFW_TRUE;
    }

    return GLFW_FALSE;
}